

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)60,(moira::Mode)7,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char cVar8;
  Ea<(moira::Mode)7,_(moira::Size)4> dst;
  Ea<(moira::Mode)7,_(moira::Size)4> local_44;
  
  *addr = *addr + 2;
  iVar5 = (*this->_vptr_Moira[5])();
  *addr = *addr + 2;
  uVar6 = (*this->_vptr_Moira[5])(this);
  local_44.reg = op & 7;
  local_44.pc = *addr;
  *addr = local_44.pc + 2;
  local_44.ext1 = (*this->_vptr_Moira[5])(this);
  local_44.ext1 = local_44.ext1 & 0xffff;
  bVar4 = str->upper;
  pcVar7 = "eori";
  if ((bool)bVar4 != false) {
    pcVar7 = "EORI";
  }
  cVar8 = *pcVar7;
  if (cVar8 != '\0') {
    do {
      pcVar7 = pcVar7 + 1;
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar8;
      cVar8 = *pcVar7;
    } while (cVar8 != '\0');
    bVar4 = str->upper;
  }
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = '.';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (~bVar4 & 1) << 5 | 0x4c;
  iVar1 = (this->tab).raw;
  while (pcVar7 = str->ptr, pcVar7 < str->base + iVar1) {
    str->ptr = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  str->ptr = pcVar7 + 1;
  *pcVar7 = '#';
  StrWriter::operator<<(str,(UInt)(iVar5 << 0x10 | uVar6 & 0xffff));
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ',';
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ' ';
  StrWriter::operator<<(str,&local_44);
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imu      ( dasmRead<S>(addr)          );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}